

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  sVar1 = (this->m_info).macroName._M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->m_info).capturedExpression._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->m_info).capturedExpression._M_string_length);
  }
  else {
    pcVar2 = (this->m_info).macroName._M_dataplus._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>((string *)local_60,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_60);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_60,
                                (ulong)(this->m_info).capturedExpression._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_30 = *plVar5;
      lStack_28 = plVar4[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar5;
      local_40 = (long *)*plVar4;
    }
    local_38 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        if( m_info.macroName.empty() )
            return m_info.capturedExpression;
        else
            return m_info.macroName + "( " + m_info.capturedExpression + " )";
    }